

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O1

void __thiscall
psy::C::InternalsTestSuite::parse
          (InternalsTestSuite *this,string source,Expectation X,SyntaxCategory syntaxCat,
          ParseOptions parseOpts)

{
  unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *this_00;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  ulong uVar4;
  pointer pSVar5;
  ParseOptions parseOptions;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  undefined8 uVar9;
  SyntaxNode *pSVar10;
  Expectation *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar11;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  char *pcVar12;
  long lVar13;
  undefined7 in_register_00000031;
  long *plVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  iterator __end1;
  long *plVar17;
  _Alloc_hider _Var18;
  char *pcVar19;
  iterator __begin1;
  pointer pSVar20;
  ostringstream ossTree;
  ostringstream ossText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  long *local_4d8;
  ulong local_4d0;
  long local_4c8 [2];
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  SyntaxNamePrinter local_478;
  long *local_450 [2];
  long local_440 [2];
  Unparser local_430;
  SourceText local_418;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  Expectation local_3d8;
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  SourceText local_1a8 [3];
  ios_base local_138 [264];
  
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  lVar13 = *(long *)CONCAT71(in_register_00000031,syntaxCat);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_498,lVar13,
             ((long *)CONCAT71(in_register_00000031,syntaxCat))[1] + lVar13);
  if (in_RDX->containsAmbiguity_ == true) {
    ParseOptions::setAmbiguityMode((ParseOptions *)&source,Diagnose);
  }
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_450,local_498._M_dataplus._M_p,
             local_498._M_dataplus._M_p + local_498._M_string_length);
  psy::SourceText::SourceText(&local_418,local_450);
  local_3e8 = source.field_2._M_allocated_capacity._0_4_;
  uStack_3e4 = source.field_2._M_allocated_capacity._4_4_;
  uStack_3e0 = source.field_2._8_4_;
  uStack_3dc = source.field_2._12_4_;
  local_3f8 = source._M_dataplus._M_p._0_4_;
  uStack_3f4 = source._M_dataplus._M_p._4_4_;
  uStack_3f0 = (undefined4)source._M_string_length;
  uStack_3ec = source._M_string_length._4_4_;
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"");
  parseOptions._4_4_ = uStack_3f4;
  parseOptions._0_4_ = local_3f8;
  parseOptions.langExts_.translations_.field_0.BF_all_._4_4_ = uStack_3ec;
  parseOptions.langExts_.translations_.field_0.BF_all_._0_4_ = uStack_3f0;
  parseOptions.langExts_.field_1.BF_all_._4_4_ = uStack_3e4;
  parseOptions.langExts_.field_1.BF_all_._0_4_ = local_3e8;
  parseOptions._28_4_ = uStack_3dc;
  parseOptions._24_4_ = uStack_3e0;
  SyntaxTree::parseText
            (local_1a8,(TextPreprocessingState)&local_418,Unknown,parseOptions,(string *)0x2,
             (SyntaxCategory)local_320);
  _Var18._M_p = local_1a8[0].rawText_._M_dataplus._M_p;
  this_00 = &this->tree_;
  local_1a8[0].rawText_._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::reset
            ((__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)
             this_00,(pointer)_Var18._M_p);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_1a8);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.rawText_._M_dataplus._M_p != &local_418.rawText_.field_2) {
    operator_delete(local_418.rawText_._M_dataplus._M_p,
                    local_418.rawText_.field_2._M_allocated_capacity + 1);
  }
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if (((in_RDX->numE_ == 0) && (in_RDX->numW_ == 0)) &&
     (bVar6 = SyntaxTree::parseExitedEarly
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                         .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl), bVar6))
  {
    if (in_RDX->unfinishedParse_ == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe4);
      std::endl<char,std::char_traits<char>>(poVar8);
      uVar9 = __cxa_allocate_exception(1);
      __cxa_throw(uVar9,&TestFailed::typeinfo,0);
    }
    goto LAB_003fbf82;
  }
  Expectation::Expectation(&local_3d8,in_RDX);
  bVar6 = checkErrorAndWarn(this,&local_3d8);
  if (local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_3d8.declarations_);
  if (local_3d8.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.ambiguityText_._M_dataplus._M_p != &local_3d8.ambiguityText_.field_2) {
    operator_delete(local_3d8.ambiguityText_._M_dataplus._M_p,
                    local_3d8.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8.descriptorsE_);
  if (!bVar6) goto LAB_003fbf82;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  SyntaxVisitor::SyntaxVisitor
            ((SyntaxVisitor *)&local_478,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  local_478.super_SyntaxDumper.super_SyntaxVisitor._vptr_SyntaxVisitor =
       (_func_int **)&PTR__SyntaxNamePrinter_00509d20;
  local_478.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.dump_.
  super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar10 = SyntaxTree::root((this_00->_M_t).
                             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                             .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  SyntaxNamePrinter::print(&local_478,pSVar10,Plain,(ostream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  SyntaxVisitor::SyntaxVisitor
            ((SyntaxVisitor *)&local_430,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  local_430.super_SyntaxDumper.super_SyntaxVisitor._vptr_SyntaxVisitor =
       (_func_int **)&PTR__SyntaxVisitor_00537228;
  pSVar10 = SyntaxTree::root((this_00->_M_t).
                             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                             .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  Unparser::unparse(&local_430,pSVar10,(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  plVar1 = (long *)((long)local_4d8 + local_4d0);
  plVar17 = local_4d8;
  if (0 < (long)local_4d0 >> 2) {
    plVar17 = (long *)((long)local_4d8 + (local_4d0 & 0xfffffffffffffffc));
    lVar13 = ((long)local_4d0 >> 2) + 1;
    plVar14 = (long *)((long)local_4d8 + 3);
    do {
      iVar7 = isspace((int)*(char *)((long)plVar14 + -3));
      if (iVar7 != 0) {
        plVar14 = (long *)((long)plVar14 + -3);
        goto LAB_003fb75c;
      }
      iVar7 = isspace((int)*(char *)((long)plVar14 + -2));
      if (iVar7 != 0) {
        plVar14 = (long *)((long)plVar14 + -2);
        goto LAB_003fb75c;
      }
      iVar7 = isspace((int)*(char *)((long)plVar14 + -1));
      if (iVar7 != 0) {
        plVar14 = (long *)((long)plVar14 + -1);
        goto LAB_003fb75c;
      }
      iVar7 = isspace((int)(char)*plVar14);
      if (iVar7 != 0) goto LAB_003fb75c;
      lVar13 = lVar13 + -1;
      plVar14 = (long *)((long)plVar14 + 4);
    } while (1 < lVar13);
  }
  lVar13 = (long)plVar1 - (long)plVar17;
  if (lVar13 == 1) {
LAB_003fb738:
    iVar7 = isspace((int)(char)*plVar17);
    plVar14 = plVar17;
    if (iVar7 == 0) {
      plVar14 = plVar1;
    }
  }
  else if (lVar13 == 2) {
LAB_003fb727:
    iVar7 = isspace((int)(char)*plVar17);
    plVar14 = plVar17;
    if (iVar7 == 0) {
      plVar17 = (long *)((long)plVar17 + 1);
      goto LAB_003fb738;
    }
  }
  else {
    plVar14 = plVar1;
    if ((lVar13 == 3) && (iVar7 = isspace((int)(char)*plVar17), plVar14 = plVar17, iVar7 == 0)) {
      plVar17 = (long *)((long)plVar17 + 1);
      goto LAB_003fb727;
    }
  }
LAB_003fb75c:
  plVar17 = (long *)((long)plVar14 + 1);
  if (plVar17 != plVar1 && plVar14 != plVar1) {
    do {
      lVar13 = *plVar17;
      iVar7 = isspace((int)(char)lVar13);
      if (iVar7 == 0) {
        *(char *)plVar14 = (char)lVar13;
        plVar14 = (long *)((long)plVar14 + 1);
      }
      plVar17 = (long *)((long)plVar17 + 1);
    } while (plVar17 != plVar1);
  }
  local_4d0 = (long)plVar14 - (long)local_4d8;
  *(char *)plVar14 = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_498._M_dataplus._M_p + local_498._M_string_length);
  _Var18._M_p = local_498._M_dataplus._M_p;
  if (0 < (long)local_498._M_string_length >> 2) {
    _Var18._M_p = local_498._M_dataplus._M_p + (local_498._M_string_length & 0xfffffffffffffffc);
    lVar13 = ((long)local_498._M_string_length >> 2) + 1;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498._M_dataplus._M_p + 3);
    do {
      iVar7 = isspace((int)paVar15->_M_local_buf[-3]);
      if (iVar7 != 0) {
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + -3);
        goto LAB_003fb880;
      }
      iVar7 = isspace((int)paVar15->_M_local_buf[-2]);
      if (iVar7 != 0) {
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + -2);
        goto LAB_003fb880;
      }
      iVar7 = isspace((int)paVar15->_M_local_buf[-1]);
      if (iVar7 != 0) {
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + -1);
        goto LAB_003fb880;
      }
      iVar7 = isspace((int)paVar15->_M_local_buf[0]);
      if (iVar7 != 0) goto LAB_003fb880;
      lVar13 = lVar13 + -1;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar15->_M_local_buf + 4);
    } while (1 < lVar13);
  }
  lVar13 = (long)paVar2 - (long)_Var18._M_p;
  if (lVar13 == 1) {
LAB_003fb85c:
    iVar7 = isspace((int)*_Var18._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var18._M_p;
    if (iVar7 == 0) {
      paVar15 = paVar2;
    }
  }
  else if (lVar13 == 2) {
LAB_003fb84b:
    iVar7 = isspace((int)*_Var18._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var18._M_p;
    if (iVar7 == 0) {
      _Var18._M_p = _Var18._M_p + 1;
      goto LAB_003fb85c;
    }
  }
  else {
    paVar15 = paVar2;
    if ((lVar13 == 3) &&
       (iVar7 = isspace((int)*_Var18._M_p),
       paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var18._M_p, iVar7 == 0)) {
      _Var18._M_p = _Var18._M_p + 1;
      goto LAB_003fb84b;
    }
  }
LAB_003fb880:
  pcVar12 = paVar15->_M_local_buf + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar12 != paVar2 && paVar15 != paVar2) {
    do {
      cVar3 = *pcVar12;
      iVar7 = isspace((int)cVar3);
      if (iVar7 == 0) {
        paVar15->_M_local_buf[0] = cVar3;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + 1);
      }
      pcVar12 = pcVar12 + 1;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar12 != paVar2);
  }
  local_498._M_string_length = (long)paVar15 - (long)local_498._M_dataplus._M_p;
  paVar15->_M_local_buf[0] = '\0';
  if (in_RDX->containsAmbiguity_ != true) {
    if ((local_4d0 == local_498._M_string_length) &&
       ((sVar11 = local_4d0, local_4d0 == 0 ||
        (iVar7 = bcmp(local_4d8,local_498._M_dataplus._M_p,local_4d0), sVar11 = extraout_RDX,
        iVar7 == 0)))) goto LAB_003fbce1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_4d8,local_4d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
               ,99);
    iVar7 = 0x10e;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
LAB_003fbc8f:
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar7);
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_003fbca1:
    uVar9 = __cxa_allocate_exception(1);
    __cxa_throw(uVar9,&TestFailed::typeinfo,0);
  }
  uVar4 = (in_RDX->ambiguityText_)._M_string_length;
  if (uVar4 == 0) {
    std::operator+(&local_4f8,&local_498,&local_498);
    sVar11 = local_4d0;
    if (local_4d0 == local_4f8._M_string_length) {
      if (local_4d0 == 0) {
        bVar6 = true;
      }
      else {
        iVar7 = bcmp(local_4d8,local_4f8._M_dataplus._M_p,local_4d0);
        bVar6 = iVar7 == 0;
        sVar11 = extraout_RDX_00;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,
                      CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                               local_4f8.field_2._M_local_buf[0]) + 1);
      sVar11 = extraout_RDX_02;
    }
    if (!bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_4d8,local_4d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
      std::operator+(&local_4f8,&local_498,&local_498);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x104);
      std::endl<char,std::char_traits<char>>(poVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,
                        CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                                 local_4f8.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_003fbca1;
    }
  }
  else {
    pcVar16 = (in_RDX->ambiguityText_)._M_dataplus._M_p;
    pcVar12 = pcVar16 + uVar4;
    pcVar19 = pcVar16;
    if (0 < (long)uVar4 >> 2) {
      pcVar19 = pcVar16 + (uVar4 & 0xfffffffffffffffc);
      lVar13 = ((long)uVar4 >> 2) + 1;
      pcVar16 = pcVar16 + 3;
      do {
        iVar7 = isspace((int)pcVar16[-3]);
        if (iVar7 != 0) {
          pcVar16 = pcVar16 + -3;
          goto LAB_003fbb36;
        }
        iVar7 = isspace((int)pcVar16[-2]);
        if (iVar7 != 0) {
          pcVar16 = pcVar16 + -2;
          goto LAB_003fbb36;
        }
        iVar7 = isspace((int)pcVar16[-1]);
        if (iVar7 != 0) {
          pcVar16 = pcVar16 + -1;
          goto LAB_003fbb36;
        }
        iVar7 = isspace((int)*pcVar16);
        if (iVar7 != 0) goto LAB_003fbb36;
        lVar13 = lVar13 + -1;
        pcVar16 = pcVar16 + 4;
      } while (1 < lVar13);
    }
    lVar13 = (long)pcVar12 - (long)pcVar19;
    if (lVar13 == 1) {
LAB_003fb9ad:
      iVar7 = isspace((int)*pcVar19);
      pcVar16 = pcVar19;
      if (iVar7 == 0) {
        pcVar16 = pcVar12;
      }
    }
    else if (lVar13 == 2) {
LAB_003fb99c:
      iVar7 = isspace((int)*pcVar19);
      pcVar16 = pcVar19;
      if (iVar7 == 0) {
        pcVar19 = pcVar19 + 1;
        goto LAB_003fb9ad;
      }
    }
    else {
      pcVar16 = pcVar12;
      if ((lVar13 == 3) && (iVar7 = isspace((int)*pcVar19), pcVar16 = pcVar19, iVar7 == 0)) {
        pcVar19 = pcVar19 + 1;
        goto LAB_003fb99c;
      }
    }
LAB_003fbb36:
    pcVar19 = pcVar16 + 1;
    if (pcVar19 != pcVar12 && pcVar16 != pcVar12) {
      do {
        cVar3 = *pcVar19;
        iVar7 = isspace((int)cVar3);
        if (iVar7 == 0) {
          *pcVar16 = cVar3;
          pcVar16 = pcVar16 + 1;
        }
        pcVar19 = pcVar19 + 1;
      } while (pcVar19 != pcVar12);
    }
    (in_RDX->ambiguityText_)._M_string_length =
         (long)pcVar16 - (long)(in_RDX->ambiguityText_)._M_dataplus._M_p;
    *pcVar16 = '\0';
    if ((local_4d0 != (in_RDX->ambiguityText_)._M_string_length) ||
       ((sVar11 = local_4d0, local_4d0 != 0 &&
        (iVar7 = bcmp(local_4d8,(in_RDX->ambiguityText_)._M_dataplus._M_p,local_4d0),
        sVar11 = extraout_RDX_01, iVar7 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_4d8,local_4d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(in_RDX->ambiguityText_)._M_dataplus._M_p,
                          (in_RDX->ambiguityText_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      iVar7 = 0x10a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      goto LAB_003fbc8f;
    }
  }
LAB_003fbce1:
  pSVar20 = (in_RDX->syntaxKinds_).
            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar5 = (in_RDX->syntaxKinds_).
           super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar20 != pSVar5) {
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    local_4f8._M_string_length = 0;
    local_4f8.field_2._M_local_buf[0] = '\0';
    do {
      to_string_abi_cxx11_(&local_4b8,(C *)(ulong)*pSVar20,(SyntaxKind)sVar11);
      std::__cxx11::string::_M_append((char *)&local_4f8,(ulong)local_4b8._M_dataplus._M_p);
      sVar11 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        sVar11 = extraout_RDX_04;
      }
      pSVar20 = pSVar20 + 1;
    } while (pSVar20 != pSVar5);
    std::__cxx11::stringbuf::str();
    pcVar12 = local_4b8._M_dataplus._M_p + local_4b8._M_string_length;
    _Var18._M_p = local_4b8._M_dataplus._M_p;
    if (0 < (long)local_4b8._M_string_length >> 2) {
      _Var18._M_p = local_4b8._M_dataplus._M_p + (local_4b8._M_string_length & 0xfffffffffffffffc);
      lVar13 = ((long)local_4b8._M_string_length >> 2) + 1;
      pcVar16 = local_4b8._M_dataplus._M_p + 3;
      do {
        iVar7 = isspace((int)pcVar16[-3]);
        if (iVar7 != 0) {
          pcVar16 = pcVar16 + -3;
          goto LAB_003fbe48;
        }
        iVar7 = isspace((int)pcVar16[-2]);
        if (iVar7 != 0) {
          pcVar16 = pcVar16 + -2;
          goto LAB_003fbe48;
        }
        iVar7 = isspace((int)pcVar16[-1]);
        if (iVar7 != 0) {
          pcVar16 = pcVar16 + -1;
          goto LAB_003fbe48;
        }
        iVar7 = isspace((int)*pcVar16);
        if (iVar7 != 0) goto LAB_003fbe48;
        lVar13 = lVar13 + -1;
        pcVar16 = pcVar16 + 4;
      } while (1 < lVar13);
    }
    lVar13 = (long)pcVar12 - (long)_Var18._M_p;
    if (lVar13 == 1) {
LAB_003fbe24:
      iVar7 = isspace((int)*_Var18._M_p);
      pcVar16 = _Var18._M_p;
      if (iVar7 == 0) {
        pcVar16 = pcVar12;
      }
    }
    else if (lVar13 == 2) {
LAB_003fbe13:
      iVar7 = isspace((int)*_Var18._M_p);
      pcVar16 = _Var18._M_p;
      if (iVar7 == 0) {
        _Var18._M_p = _Var18._M_p + 1;
        goto LAB_003fbe24;
      }
    }
    else {
      pcVar16 = pcVar12;
      if ((lVar13 == 3) && (iVar7 = isspace((int)*_Var18._M_p), pcVar16 = _Var18._M_p, iVar7 == 0))
      {
        _Var18._M_p = _Var18._M_p + 1;
        goto LAB_003fbe13;
      }
    }
LAB_003fbe48:
    pcVar19 = pcVar16 + 1;
    if (pcVar19 != pcVar12 && pcVar16 != pcVar12) {
      do {
        cVar3 = *pcVar19;
        iVar7 = isspace((int)cVar3);
        if (iVar7 == 0) {
          *pcVar16 = cVar3;
          pcVar16 = pcVar16 + 1;
        }
        pcVar19 = pcVar19 + 1;
      } while (pcVar19 != pcVar12);
    }
    _Var18._M_p = local_4b8._M_dataplus._M_p;
    local_4b8._M_string_length = (long)pcVar16 - (long)local_4b8._M_dataplus._M_p;
    *pcVar16 = '\0';
    if ((local_4b8._M_string_length != local_4f8._M_string_length) ||
       ((local_4b8._M_string_length != 0 &&
        (iVar7 = bcmp(local_4b8._M_dataplus._M_p,local_4f8._M_dataplus._M_p,
                      local_4b8._M_string_length), iVar7 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4b8._M_dataplus._M_p,
                          local_4b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x119);
      std::endl<char,std::char_traits<char>>(poVar8);
      uVar9 = __cxa_allocate_exception(1);
      __cxa_throw(uVar9,&TestFailed::typeinfo,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var18._M_p != &local_4b8.field_2) {
      operator_delete(_Var18._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,
                      CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                               local_4f8.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8,local_4c8[0] + 1);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&local_430);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_478.dump_.
      super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.dump_.
                    super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_478.dump_.
                          super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_478.dump_.
                          super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&local_478);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
LAB_003fbf82:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InternalsTestSuite::parse(std::string source,
                               Expectation X,
                               SyntaxTree::SyntaxCategory syntaxCat,
                               ParseOptions parseOpts)
{
    auto text = source;

#ifdef DBG_DIAGNOSTICS
    if (X.numW_ > 0 || X.numE_ > 0) {
        std::cout << std::endl;
        if (X.numW_ > 0)
            std::cout << "\t\t[expect (parser) WARNING]\n";
        if (X.numE_ > 0)
            std::cout << "\t\t[expect (parser) ERROR]\n";
    }
#endif

    if (X.containsAmbiguity_)
        parseOpts.setAmbiguityMode(ParseOptions::AmbiguityMode::Diagnose);

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  TextCompleteness::Fragment,
                                  parseOpts,
                                  "",
                                  syntaxCat);

    if (X.numE_ == 0 && X.numW_ == 0 && tree_->parseExitedEarly()) {
        PSY_EXPECT_TRUE(X.unfinishedParse_);
        return;
    }

    if (!checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}